

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall fmp4_stream::sc35_splice_info::print(sc35_splice_info *this,bool verbose)

{
  ostream *poVar1;
  long lVar2;
  undefined7 in_register_00000031;
  char *pcVar3;
  
  lVar2 = std::cout;
  if ((int)CONCAT71(in_register_00000031,verbose) != 0) {
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," table id: ",0xb);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," section_syntax_indicator: ",0x1b);
    poVar1 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," private_indicator: ",0x14);
    poVar1 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," section_length: ",0x11);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," protocol_version: ",0x13);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," encrypted_packet: ",0x13);
    poVar1 = std::ostream::_M_insert<bool>(true);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," encryption_algorithm: ",0x17);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," pts_adjustment: ",0x11);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," cw_index: ",0xb);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," tier: ",7);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," splice_command_length: ",0x18);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," splice_command_type: ",0x16);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," descriptor_loop_length: ",0x19);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," pts_adjustment: ",0x11)
  ;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Command type: ",0xf);
  lVar2 = std::cout;
  switch(this->splice_command_type_) {
  case '\0':
    std::ostream::operator<<((ostream *)&std::cout,0);
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    pcVar3 = " splice null ";
    lVar2 = 0xd;
    break;
  default:
    return;
  case '\x04':
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    pcVar3 = " splice schedule ";
    lVar2 = 0x11;
    break;
  case '\x05':
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," splice insert ",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
    std::ostream::put(-0x78);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," event_id: ",0xb);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = std::cout;
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," cancel indicator: ",0x13);
    poVar1 = std::ostream::_M_insert<bool>(true);
    goto LAB_0010fcf3;
  case '\x06':
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    pcVar3 = "time signal ";
    lVar2 = 0xc;
    break;
  case '\a':
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
    *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
    pcVar3 = "bandwidth reservation ";
    lVar2 = 0x16;
  }
  poVar1 = (ostream *)&std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
LAB_0010fcf3:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void sc35_splice_info::print(bool verbose) const
	{
		if (verbose) {
			std::cout << std::setw(33) << std::left << " table id: " << (unsigned int)table_id_ << std::endl;
			std::cout << std::setw(33) << std::left << " section_syntax_indicator: " << section_syntax_indicator_ << std::endl;
			std::cout << std::setw(33) << std::left << " private_indicator: " << private_indicator_ << std::endl;
			std::cout << std::setw(33) << std::left << " section_length: " << (unsigned int)section_length_ << std::endl;
			std::cout << std::setw(33) << std::left << " protocol_version: " << (unsigned int)protocol_version_ << std::endl;
			std::cout << std::setw(33) << std::left << " encrypted_packet: " << encrypted_packet_ << std::endl;
			std::cout << std::setw(33) << std::left << " encryption_algorithm: " << (unsigned int)encryption_algorithm_ << std::endl;
			std::cout << std::setw(33) << std::left << " pts_adjustment: " << pts_adjustment_ << std::endl;
			std::cout << std::setw(33) << std::left << " cw_index: " << (unsigned int)cw_index_ << std::endl;
			std::cout << std::setw(33) << std::left << " tier: " << tier_ << std::endl;
			std::cout << std::setw(33) << std::left << " splice_command_length: " << splice_command_length_ << std::endl;
			std::cout << std::setw(33) << std::left << " splice_command_type: " << (unsigned int)splice_command_type_ << std::endl;
			std::cout << std::setw(33) << std::left << " descriptor_loop_length: " << descriptor_loop_length_ << std::endl;
		}
		std::cout << std::setw(33) << std::left << " pts_adjustment: " << pts_adjustment_ << std::endl;
		std::cout << std::setw(33) << std::left << " Command type: ";

		switch (splice_command_type_)
		{
		case 0x00: std::cout << 0x00; // prints "1"
			std::cout << std::setw(33) << std::left << " splice null " << std::endl;
			break;       // and exits the switch
		case 0x04:
			std::cout << std::setw(33) << std::left << " splice schedule " << std::endl;
			break;
		case 0x05:
			std::cout << std::setw(33) << std::left << " splice insert " << std::endl;
			std::cout << std::setw(33) << std::left << " event_id: " << splice_insert_event_id_ << std::endl;
			std::cout << std::setw(33) << std::left << " cancel indicator: " << splice_event_cancel_indicator_ << std::endl;
			break;
		case 0x06:
			std::cout << std::setw(33) << std::left << "time signal " << std::endl;
			break;
		case 0x07:
			std::cout << std::setw(33) << std::left << "bandwidth reservation " << std::endl;
			break;
		}
	}